

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

bool __thiscall QOpenGLShader::compileSourceFile(QOpenGLShader *this,QString *fileName)

{
  ulong uVar1;
  QDebug *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArray contents;
  QFile file;
  char *in_stack_000000d8;
  undefined4 in_stack_ffffffffffffff68;
  OpenModeFlag in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  bool local_61;
  char *in_stack_ffffffffffffffb8;
  QOpenGLShader *in_stack_ffffffffffffffc0;
  QDebug local_28 [2];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_18,(QString *)in_RSI);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  uVar1 = QFile::open((QFlags_conflict *)&local_18);
  if ((uVar1 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_RDI,in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning();
    QDebug::operator<<(in_RSI,in_stack_ffffffffffffffb8);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_RDI);
    QDebug::~QDebug(local_28);
    local_61 = false;
  }
  else {
    QIODevice::readAll();
    QByteArray::constData((QByteArray *)0x172aad);
    local_61 = compileSourceCode(in_stack_ffffffffffffffc0,in_stack_000000d8);
    QByteArray::~QByteArray((QByteArray *)0x172ad2);
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_61;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShader::compileSourceFile(const QString& fileName)
{
    QFile file(fileName);
    if (!file.open(QFile::ReadOnly)) {
        qWarning() << "QOpenGLShader: Unable to open file" << fileName;
        return false;
    }

    QByteArray contents = file.readAll();
    return compileSourceCode(contents.constData());
}